

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O3

void __thiscall
cmQtAutoGenerators::ParseForUic
          (cmQtAutoGenerators *this,string *absFilename,string *contentsString,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          *includedUis)

{
  char *pcVar1;
  bool bVar2;
  char *pcVar3;
  mapped_type *this_00;
  char *pcVar4;
  string currentUi;
  string basename;
  string realName;
  RegularExpression uiIncludeRegExp;
  string local_188;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *local_168;
  string local_160;
  string local_140;
  long *local_120 [2];
  long local_110 [2];
  RegularExpression local_100;
  
  if ((this->UicExecutable)._M_string_length != 0) {
    local_100.program = (char *)0x0;
    local_168 = includedUis;
    cmsys::RegularExpression::compile
              (&local_100,"[\n][ \t]*#[ \t]*include[ \t]+[\"<](([^ \">]+/)?ui_[^ \">/]+\\.h)[\">]");
    cmsys::SystemTools::GetRealPath(&local_140,absFilename,(string *)0x0);
    pcVar4 = (contentsString->_M_dataplus)._M_p;
    pcVar3 = strstr(pcVar4,"ui_");
    if (pcVar3 != (char *)0x0) {
      bVar2 = cmsys::RegularExpression::find(&local_100,pcVar4);
      if (bVar2) {
        pcVar4 = (char *)0x0;
        do {
          if (local_100.startp[1] == (char *)0x0) {
            local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
            local_188._M_string_length = 0;
            local_188.field_2._M_local_buf[0] = '\0';
          }
          else {
            local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_188,local_100.startp[1],local_100.endp[1]);
          }
          cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_160,&local_188);
          std::__cxx11::string::substr((ulong)local_120,(ulong)&local_160);
          std::__cxx11::string::operator=((string *)&local_160,(string *)local_120);
          if (local_120[0] != local_110) {
            operator_delete(local_120[0],local_110[0] + 1);
          }
          this_00 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                    ::operator[](local_168,&local_140);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(this_00,&local_160);
          pcVar1 = local_100.searchstring;
          pcVar3 = local_100.endp[0];
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != &local_160.field_2) {
            operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != &local_188.field_2) {
            operator_delete(local_188._M_dataplus._M_p,
                            CONCAT71(local_188.field_2._M_allocated_capacity._1_7_,
                                     local_188.field_2._M_local_buf[0]) + 1);
          }
          pcVar4 = pcVar3 + ((long)pcVar4 - (long)pcVar1);
          bVar2 = cmsys::RegularExpression::find
                            (&local_100,(contentsString->_M_dataplus)._M_p + (long)pcVar4);
        } while (bVar2);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    if (local_100.program != (char *)0x0) {
      operator_delete__(local_100.program);
    }
  }
  return;
}

Assistant:

void cmQtAutoGenerators::ParseForUic(const std::string& absFilename,
                const std::string& contentsString,
                std::map<std::string, std::vector<std::string> >& includedUis)
{
  if (this->UicExecutable.empty())
    {
    return;
    }
  cmsys::RegularExpression uiIncludeRegExp(
              "[\n][ \t]*#[ \t]*include[ \t]+"
              "[\"<](([^ \">]+/)?ui_[^ \">/]+\\.h)[\">]");

  std::string::size_type matchOffset = 0;

  const std::string realName =
                   cmsys::SystemTools::GetRealPath(absFilename);

  matchOffset = 0;
  if ((strstr(contentsString.c_str(), "ui_") != NULL)
                                    && (uiIncludeRegExp.find(contentsString)))
    {
    do
      {
      const std::string currentUi = uiIncludeRegExp.match(1);

      std::string basename = cmsys::SystemTools::
                                  GetFilenameWithoutLastExtension(currentUi);

      // basename should be the part of the ui filename used for
      // finding the correct header, so we need to remove the ui_ part
      basename = basename.substr(3);

      includedUis[realName].push_back(basename);

      matchOffset += uiIncludeRegExp.end();
      } while(uiIncludeRegExp.find(contentsString.c_str() + matchOffset));
    }
}